

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O1

int __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeIntoClearedMessages
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *from)

{
  int iVar1;
  Rep *pRVar2;
  long lVar3;
  long lVar4;
  LogMessage *this_00;
  RepeatedPtrFieldBase *pRVar5;
  uint uVar6;
  RepeatedPtrFieldBase *pRVar7;
  ulong uVar8;
  string_view sVar9;
  LogMessage local_40;
  
  pRVar7 = this;
  if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
    pRVar2 = rep(this);
    pRVar7 = (RepeatedPtrFieldBase *)pRVar2->elements;
  }
  iVar1 = this->current_size_;
  pRVar5 = from;
  if (((ulong)from->tagged_rep_or_elem_ & 1) != 0) {
    pRVar2 = rep(from);
    pRVar5 = (RepeatedPtrFieldBase *)pRVar2->elements;
  }
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    uVar6 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
  }
  else {
    pRVar2 = rep(this);
    uVar6 = pRVar2->allocated_size;
  }
  uVar6 = uVar6 - this->current_size_;
  if (from->current_size_ < (int)uVar6) {
    uVar6 = from->current_size_;
  }
  if (0 < (int)uVar6) {
    uVar8 = 0;
    do {
      if ((long *)(&pRVar5->tagged_rep_or_elem_)[uVar8] == (long *)0x0) {
        MergeIntoClearedMessages((RepeatedPtrFieldBase *)&local_40);
LAB_002b5942:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
                   ,0xb5,"TypeId::Get(*src[i]) == TypeId::Get(*src[0])");
        sVar9 = MessageLite::GetTypeName((MessageLite *)(&pRVar5->tagged_rep_or_elem_)[uVar8]);
        this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,sVar9);
        sVar9._M_str = " vs ";
        sVar9._M_len = 4;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (this_00,sVar9);
        sVar9 = MessageLite::GetTypeName((MessageLite *)pRVar5->tagged_rep_or_elem_);
        absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,sVar9);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_40);
      }
      lVar3 = (**(code **)(*(&pRVar5->tagged_rep_or_elem_)[uVar8] + 0x20))();
      lVar4 = (**(code **)(*pRVar5->tagged_rep_or_elem_ + 0x20))();
      if (lVar3 != lVar4) goto LAB_002b5942;
      MessageLite::CheckTypeAndMergeFrom
                ((MessageLite *)(&pRVar7->tagged_rep_or_elem_)[(long)iVar1 + uVar8],
                 (MessageLite *)(&pRVar5->tagged_rep_or_elem_)[uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  return uVar6;
}

Assistant:

int RepeatedPtrFieldBase::MergeIntoClearedMessages(
    const RepeatedPtrFieldBase& from) {
  Prefetch5LinesFrom1Line(&from);
  auto dst = reinterpret_cast<MessageLite**>(elements() + current_size_);
  auto src = reinterpret_cast<MessageLite* const*>(from.elements());
  int count = std::min(ClearedCount(), from.current_size_);
  for (int i = 0; i < count; ++i) {
    ABSL_DCHECK(src[i] != nullptr);
    ABSL_DCHECK(TypeId::Get(*src[i]) == TypeId::Get(*src[0]))
        << src[i]->GetTypeName() << " vs " << src[0]->GetTypeName();
    dst[i]->CheckTypeAndMergeFrom(*src[i]);
  }
  return count;
}